

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatIndexBuilder.cpp
# Opt level: O1

void flat_radixsort(vector<unsigned_long,_std::allocator<unsigned_long>_> *data,uint64_t max_fileid)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> swap;
  allocator_type local_39;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_38,
             (long)(data->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)(data->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                   .super__Vector_impl_data._M_start >> 3,&local_39);
  uVar3 = 0;
  if ((int)max_fileid != 0) {
    uVar1 = max_fileid & 0xffffffff;
    do {
      uVar1 = uVar1 >> 8;
      uVar3 = uVar3 + 8;
      uVar2 = (uint)max_fileid;
      max_fileid = uVar1;
    } while (0xff < uVar2);
  }
  uVar2 = 0xfffffff8;
  do {
    uVar2 = uVar2 + 8;
    if (uVar2 < uVar3 || 0x27 < uVar2) {
      countsort(data,&local_38,uVar2);
    }
  } while (uVar2 < 0x38);
  if (local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void flat_radixsort(std::vector<uint64_t> *data, uint64_t max_fileid) {
    std::vector<uint64_t> swap(data->size());
    int skip_to = count_bytes(max_fileid) * 8;
    for (int shift = 0; shift < 64; shift += 8) {
        if (shift >= skip_to && shift < 40) {
            continue;
        }
        countsort(data, &swap, shift);
    }
}